

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                    *b)

{
  ArrayOptions *pAVar1;
  QLatin1String *pQVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QChar *it;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (a->d).d;
  lVar5 = (a->d).size;
  lVar8 = (b->b).m_size +
          *(long *)&(b->a).a.a.a.a.a.a + lVar5 +
          ((*(QString **)((long)&(b->a).a.a.a.a.a.a + 0x10))->d).size + (b->a).a.a.a.a.a.b.m_size +
          (b->a).a.a.a.b.d.size + (((b->a).a.b)->d).size + (b->a).b.m_size + 2;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar5);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) goto LAB_0024b98f;
    if (0 < lVar8) {
      lVar5 = (a->d).size;
      goto LAB_0024b9e4;
    }
  }
  else {
LAB_0024b98f:
    lVar6 = (pDVar4->super_QArrayData).alloc;
    lVar5 = (a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar6 - lVar5) - lVar7 < lVar8) {
      lVar3 = lVar6 * 2;
      if (lVar6 * 2 < lVar8) {
        lVar3 = lVar8;
      }
      lVar8 = lVar3;
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - lVar7 <= lVar8)) {
LAB_0024b9e4:
        if (lVar8 < lVar5) {
          lVar8 = lVar5;
        }
        QString::reallocData((longlong)a,(AllocationOption)lVar8);
        pDVar4 = (a->d).d;
        if (pDVar4 == (Data *)0x0) goto LAB_0024ba14;
        lVar6 = (pDVar4->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0024ba25;
  }
LAB_0024ba14:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0024ba25:
  local_38 = (QChar *)((a->d).ptr + (a->d).size);
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>_>
  ::appendTo<QChar>((type *)b,&local_38);
  pQVar2 = &(b->a).b;
  lVar5 = pQVar2->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar2,local_38);
  local_38 = local_38 + lVar5;
  lVar5 = (b->b).m_size;
  QAbstractConcatenable::appendLatin1To(b->b,local_38);
  local_38 = local_38 + lVar5;
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}